

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_help.cpp
# Opt level: O3

int __thiscall ktx::OptionsHelp::init(OptionsHelp *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 uVar2;
  int iVar3;
  int extraout_EAX;
  undefined1 local_149;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  string local_128;
  shared_ptr<const_cxxopts::Value> local_108;
  OptionAdder local_f0;
  string local_c8;
  string local_a8;
  string local_88;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  long *local_50 [2];
  long local_40 [2];
  
  local_148 = &local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"");
  uVar2 = local_138._M_allocated_capacity._0_4_;
  local_f0.m_group._M_string_length = local_140;
  if (local_148 == &local_138) {
    local_128.field_2._8_4_ = local_138._8_4_;
    local_128.field_2._12_4_ = local_138._12_4_;
    local_148 = &local_128.field_2;
  }
  local_128.field_2._M_allocated_capacity._4_4_ = local_138._M_allocated_capacity._4_4_;
  local_128.field_2._M_allocated_capacity._0_4_ = local_138._M_allocated_capacity._0_4_;
  local_140 = 0;
  local_138._M_allocated_capacity._0_4_ = local_138._M_allocated_capacity._0_4_ & 0xffffff00;
  paVar1 = &local_f0.m_group.field_2;
  if (local_148 == &local_128.field_2) {
    local_f0.m_group.field_2._M_allocated_capacity =
         CONCAT44(local_138._M_allocated_capacity._4_4_,uVar2);
    local_f0.m_group.field_2._8_4_ = local_128.field_2._8_4_;
    local_f0.m_group.field_2._12_4_ = local_128.field_2._12_4_;
    local_f0.m_group._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_f0.m_group.field_2._M_allocated_capacity = local_128.field_2._M_allocated_capacity;
    local_f0.m_group._M_dataplus._M_p = (pointer)local_148;
  }
  local_148 = &local_138;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  local_f0.m_options = (Options *)ctx;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"command","");
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"The command for which usage should be displayed.","");
  std::
  __shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::__cxx11::string>>>
            ((__shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              *)&local_68,
             (allocator<cxxopts::values::standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_149);
  local_108.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_68;
  local_108.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       uStack_64;
  local_108.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = uStack_60;
  local_108.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = uStack_5c;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
  cxxopts::OptionAdder::operator()(&local_f0,&local_128,&local_a8,&local_108,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_108.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_108.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_108.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_108.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.m_group._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.m_group._M_dataplus._M_p,
                    local_f0.m_group.field_2._M_allocated_capacity + 1);
  }
  if (local_148 != &local_138) {
    operator_delete(local_148,
                    CONCAT44(local_138._M_allocated_capacity._4_4_,
                             local_138._M_allocated_capacity._0_4_) + 1);
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"command","");
  cxxopts::Options::parse_positional((Options *)ctx,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"<command>","");
  iVar3 = std::__cxx11::string::operator=((string *)(ctx + 0x60),(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
    iVar3 = extraout_EAX;
  }
  return iVar3;
}

Assistant:

void init(cxxopts::Options& opts) {
        opts.add_options()
                ("command", "The command for which usage should be displayed.", cxxopts::value<std::string>());
        opts.parse_positional("command");
        opts.positional_help("<command>");
    }